

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::simplify_impl<viennamath::rt_expression_interface<double>,double>
          (long *lhs,long *param_2)

{
  ulong uVar1;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *prVar2;
  rt_expression_interface<double> *prVar3;
  op_interface_type *poVar4;
  rt_expression_interface<double> *rhs;
  double dVar5;
  double val_1;
  double val;
  rt_expression_interface<double> *rhs_local;
  rt_expression_interface<double> *lhs_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *local_10;
  
  uVar1 = (**(code **)(*lhs + 0x40))();
  if ((uVar1 & 1) == 0) {
    uVar1 = (**(code **)(*param_2 + 0x40))();
    if ((uVar1 & 1) == 0) {
      local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
      prVar3 = (rt_expression_interface<double> *)(**(code **)(*lhs + 0x80))();
      poVar4 = (op_interface_type *)operator_new(8);
      poVar4->_vptr_op_interface = (_func_int **)0x0;
      op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>::
      op_binary((op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>
                 *)poVar4);
      rhs = (rt_expression_interface<double> *)(**(code **)(*param_2 + 0x80))();
      rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                (local_10,prVar3,poVar4,rhs);
    }
    else {
      dVar5 = (double)(**(code **)(*param_2 + 0x48))();
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                   operator_new(0x20);
        prVar3 = (rt_expression_interface<double> *)(**(code **)(*lhs + 0x80))();
        poVar4 = (op_interface_type *)operator_new(8);
        poVar4->_vptr_op_interface = (_func_int **)0x0;
        op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>::
        op_binary((op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>
                   *)poVar4);
        prVar2 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                 operator_new(0x10);
        rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar2,dVar5)
        ;
        rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                  (local_10,prVar3,poVar4,(rt_expression_interface<double> *)prVar2);
      }
      else {
        local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                   (**(code **)(*lhs + 0x80))();
      }
    }
  }
  else {
    dVar5 = (double)(**(code **)(*lhs + 0x48))();
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
      prVar2 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
               operator_new(0x10);
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar2,dVar5);
      poVar4 = (op_interface_type *)operator_new(8);
      poVar4->_vptr_op_interface = (_func_int **)0x0;
      op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>::
      op_binary((op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>
                 *)poVar4);
      prVar3 = (rt_expression_interface<double> *)(**(code **)(*param_2 + 0x80))();
      rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                (local_10,(rt_expression_interface<double> *)prVar2,poVar4,prVar3);
    }
    else {
      local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
      prVar2 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
               operator_new(0x10);
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar2,-1.0);
      poVar4 = (op_interface_type *)operator_new(8);
      poVar4->_vptr_op_interface = (_func_int **)0x0;
      op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::
      op_binary((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>
                 *)poVar4);
      prVar3 = (rt_expression_interface<double> *)(**(code **)(*param_2 + 0x80))();
      rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                (local_10,(rt_expression_interface<double> *)prVar2,poVar4,prVar3);
    }
  }
  return &local_10->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * simplify_impl(const InterfaceType * lhs, op_minus<NumericT>, const InterfaceType * rhs)
  {
        if (lhs->is_constant())
        {
          NumericT val = lhs->unwrap();
          if (val == 0.0)
          {
            return new rt_binary_expr<InterfaceType>(new rt_constant<NumericT, InterfaceType>(-1),
                                                     new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                     rhs->simplify());
          }

          return new rt_binary_expr<InterfaceType>(new rt_constant<NumericT, InterfaceType>(val),
                                                   new op_binary<op_minus<NumericT>, InterfaceType>(),
                                                   rhs->simplify());
        }
        else if (rhs->is_constant())
        {
          NumericT val = rhs->unwrap();
          if (val == 0.0)
            return lhs->simplify();

          return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                   new op_binary<op_minus<NumericT>, InterfaceType>(),
                                                   new rt_constant<NumericT, InterfaceType>(val));
        }

        return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                 new op_binary<op_minus<NumericT>, InterfaceType>(),
                                                 rhs->simplify());
  }